

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O2

void builder_move_assign_after_releaseraw_test<TestHeapBuilder>(TestHeapBuilder *b1)

{
  uint val;
  bool val_00;
  Offset<MyGame::Example::Monster> OVar1;
  uint8_t *__p;
  shared_ptr<unsigned_char> raw;
  string local_c8;
  size_t offset;
  size_t size;
  TestHeapBuilder src;
  
  OVar1 = populate1(&b1->super_FlatBufferBuilder);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            (&b1->super_FlatBufferBuilder,OVar1,(char *)0x0);
  __p = flatbuffers::FlatBufferBuilderImpl<false>::ReleaseRaw
                  (&b1->super_FlatBufferBuilder,&size,&offset);
  std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_char,builder_move_assign_after_releaseraw_test<TestHeapBuilder>(TestHeapBuilder)::_lambda(unsigned_char*)_1_,void>
            ((__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&raw,__p,
             (anon_class_8_1_89918cff_for__M_tp)size);
  TestHeapBuilder::TestHeapBuilder(&src);
  OVar1 = populate2(&src.super_FlatBufferBuilder);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            (&src.super_FlatBufferBuilder,OVar1,(char *)0x0);
  val = src.super_FlatBufferBuilder.buf_.size_;
  flatbuffers::FlatBufferBuilderImpl<false>::operator=
            (&b1->super_FlatBufferBuilder,&src.super_FlatBufferBuilder);
  TestEq<unsigned_int,unsigned_int>
            ((b1->super_FlatBufferBuilder).buf_.size_,val,"\'b1.GetSize()\' != \'src_size\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x48,
             "void builder_move_assign_after_releaseraw_test(Builder) [Builder = TestHeapBuilder]");
  m2_name_abi_cxx11_();
  val_00 = release_n_verify(&b1->super_FlatBufferBuilder,&local_c8,Color_Green);
  TestEq<bool,bool>(true,val_00,"\'true\' != \'release_n_verify(b1, m2_name(), m2_color())\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                    ,0x49,
                    "void builder_move_assign_after_releaseraw_test(Builder) [Builder = TestHeapBuilder]"
                   );
  std::__cxx11::string::~string((string *)&local_c8);
  TestEq<unsigned_int,int>
            (src.super_FlatBufferBuilder.buf_.size_,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x4a,
             "void builder_move_assign_after_releaseraw_test(Builder) [Builder = TestHeapBuilder]");
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&src.super_FlatBufferBuilder);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&raw.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void builder_move_assign_after_releaseraw_test(Builder b1) {
  auto root_offset1 = populate1(b1);
  b1.Finish(root_offset1);
  size_t size, offset;

  uint8_t *rr = b1.ReleaseRaw(size, offset);
  std::shared_ptr<uint8_t> raw(
      rr, [size](uint8_t *ptr) {
        flatbuffers::DefaultAllocator::dealloc(ptr, size);
      });
  Builder src;
  auto root_offset2 = populate2(src);
  src.Finish(root_offset2);
  auto src_size = src.GetSize();
  // Move into a released builder.
  b1 = std::move(src);
  TEST_EQ_FUNC(b1.GetSize(), src_size);
  TEST_ASSERT_FUNC(release_n_verify(b1, m2_name(), m2_color()));
  TEST_EQ_FUNC(src.GetSize(), 0);
}